

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O0

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  allocator<char> *__s;
  undefined4 in_ECX;
  undefined4 in_ESI;
  allocator<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  allocator<char> local_29 [13];
  undefined4 local_1c;
  
  *(undefined4 *)in_RDI = in_ESI;
  __s = in_RDI + 8;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffc0,(char *)__s,in_RDI);
  std::allocator<char>::~allocator(local_29);
  *(undefined4 *)(in_RDI + 0x28) = local_1c;
  ExtractSummary_abi_cxx11_(in_stack_ffffffffffffffc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffffc0,(char *)__s,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc3);
  return;
}

Assistant:

TestPartResult(Type a_type,
                 const char* a_file_name,
                 int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == NULL ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {
  }